

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score.cc
# Opt level: O2

real_t __thiscall xLearn::FMScore::CalcScore(FMScore *this,SparseRow *row,Model *model,real_t norm)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 (*pauVar3) [16];
  uint uVar4;
  uint uVar5;
  float fVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  index_t d_1;
  int iVar10;
  int iVar11;
  ulong __n;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar14 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 in_ZMM3 [64];
  vector<float,_std::allocator<float>_> sv;
  allocator_type local_55;
  float local_54;
  real_t local_50;
  value_type_conflict1 local_4c;
  _Vector_base<float,_std::allocator<float>_> local_48;
  undefined1 extraout_var [60];
  
  auVar16 = in_ZMM3._0_16_;
  auVar13 = in_ZMM1._0_16_;
  auVar15._4_60_ = in_register_00001204;
  auVar15._0_4_ = norm;
  local_50 = norm;
  if (norm < 0.0) {
    auVar14._0_4_ = sqrtf(norm);
    auVar14._4_60_ = extraout_var;
    auVar12 = auVar14._0_16_;
  }
  else {
    auVar12 = vsqrtss_avx(auVar15._0_16_,auVar15._0_16_);
  }
  auVar15 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar13 = vcvtusi2ss_avx512f(auVar13,*(undefined4 *)(model + 0x54));
  uVar4 = *(uint *)(model + 0x48);
  lVar7 = *(long *)row;
  iVar10 = vcvttss2usi_avx512f(auVar13);
  for (; lVar7 != *(long *)(row + 8); lVar7 = lVar7 + 0xc) {
    if (*(uint *)(lVar7 + 4) < uVar4) {
      auVar13 = vfmadd231ss_fma(auVar15._0_16_,auVar12,
                                ZEXT416((uint)(*(float *)(lVar7 + 8) *
                                              *(float *)(*(long *)(model + 0x58) +
                                                        (ulong)(*(uint *)(lVar7 + 4) * iVar10) * 4))
                                       ));
      auVar15 = ZEXT1664(auVar13);
    }
  }
  local_54 = **(float **)(model + 0x68);
  auVar13 = vcvtusi2ss_avx512f(auVar16,*(undefined4 *)(model + 0x50));
  local_4c = 0.0;
  auVar13 = ZEXT416((uint)(auVar13._0_4_ * 0.25));
  auVar13 = vroundss_avx(auVar13,auVar13,10);
  iVar11 = vcvttss2usi_avx512f(auVar13);
  __n = (ulong)(uint)(iVar11 * 4);
  iVar10 = iVar10 * iVar11 * 4;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_48,__n,&local_4c,&local_55);
  for (lVar7 = *(long *)row; lVar7 != *(long *)(row + 8); lVar7 = lVar7 + 0xc) {
    uVar5 = *(uint *)(lVar7 + 4);
    if (uVar5 < uVar4) {
      fVar6 = local_50 * *(float *)(lVar7 + 8);
      lVar8 = *(long *)(model + 0x60);
      for (uVar9 = 0; uVar9 < __n; uVar9 = uVar9 + 4) {
        pfVar1 = (float *)((ulong)(uVar5 * iVar10) * 4 + lVar8 + uVar9 * 4);
        pfVar2 = local_48._M_impl.super__Vector_impl_data._M_start + uVar9;
        auVar13._0_4_ = fVar6 * *pfVar1 + *pfVar2;
        auVar13._4_4_ = fVar6 * pfVar1[1] + pfVar2[1];
        auVar13._8_4_ = fVar6 * pfVar1[2] + pfVar2[2];
        auVar13._12_4_ = fVar6 * pfVar1[3] + pfVar2[3];
        *(undefined1 (*) [16])(local_48._M_impl.super__Vector_impl_data._M_start + uVar9) = auVar13;
      }
    }
  }
  auVar14 = ZEXT1664(ZEXT816(0) << 0x40);
  for (lVar8 = *(long *)row; lVar8 != lVar7; lVar8 = lVar8 + 0xc) {
    if (*(uint *)(lVar8 + 4) < uVar4) {
      fVar6 = local_50 * *(float *)(lVar8 + 8);
      uVar9 = 0;
      while (uVar9 < __n) {
        pfVar1 = (float *)(*(long *)(model + 0x60) + (ulong)(*(uint *)(lVar8 + 4) * iVar10) * 4 +
                          uVar9 * 4);
        auVar16._0_4_ = fVar6 * *pfVar1;
        auVar16._4_4_ = fVar6 * pfVar1[1];
        auVar16._8_4_ = fVar6 * pfVar1[2];
        auVar16._12_4_ = fVar6 * pfVar1[3];
        pauVar3 = (undefined1 (*) [16])(local_48._M_impl.super__Vector_impl_data._M_start + uVar9);
        uVar9 = uVar9 + 4;
        auVar13 = vsubps_avx(*pauVar3,auVar16);
        auVar14 = ZEXT1664(CONCAT412(auVar14._12_4_ + auVar16._12_4_ * auVar13._12_4_,
                                     CONCAT48(auVar14._8_4_ + auVar16._8_4_ * auVar13._8_4_,
                                              CONCAT44(auVar14._4_4_ + auVar16._4_4_ * auVar13._4_4_
                                                       ,auVar14._0_4_ +
                                                        auVar16._0_4_ * auVar13._0_4_))));
      }
    }
  }
  auVar13 = vhaddps_avx(auVar14._0_16_,auVar14._0_16_);
  fVar6 = auVar15._0_4_ + local_54;
  auVar13 = vhaddps_avx(auVar13,auVar13);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
  return fVar6 + auVar13._0_4_ * 0.5;
}

Assistant:

real_t FMScore::CalcScore(const SparseRow* row,
                          Model& model,
                          real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  real_t t = 0;
  index_t aux_size = model.GetAuxiliarySize();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature in Prediction
    if (feat_id >= num_feat) continue;
    t += (iter->feat_val * w[feat_id*aux_size] * sqrt_norm);
  }
  // bias
  w = model.GetParameter_b();
  t += w[0];
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t aligned_k = model.get_aligned_k();
  index_t align0 = model.get_aligned_k() * aux_size;
  std::vector<real_t> sv(aligned_k, 0);
  real_t* s = sv.data();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature in Prediction
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    for (index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 const XMMw = _mm_load_ps(w+d);
      XMMs = _mm_add_ps(XMMs, _mm_mul_ps(XMMw, XMMv));
      _mm_store_ps(s+d, XMMs);
    }
  }
  __m128 XMMt = _mm_set1_ps(0.0f);
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature in Prediction
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    for (index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 XMMw = _mm_load_ps(w+d);
      __m128 XMMwv = _mm_mul_ps(XMMw, XMMv);
      XMMt = _mm_add_ps(XMMt,
         _mm_mul_ps(XMMwv, _mm_sub_ps(XMMs, XMMwv)));
    }
  }
  XMMt = _mm_hadd_ps(XMMt, XMMt);
  XMMt = _mm_hadd_ps(XMMt, XMMt);
  real_t t_all;
  _mm_store_ss(&t_all, XMMt);
  t_all *= 0.5;
  t_all += t;
  return t_all;
}